

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O0

string * WasmCGenCast(string *__return_storage_ptr__,PCSTR type,string *value)

{
  allocator<char> local_22;
  undefined1 local_21;
  string *local_20;
  string *value_local;
  PCSTR type_local;
  string *result;
  
  local_21 = 0;
  local_20 = value;
  value_local = (string *)type;
  type_local = (PCSTR)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"((",&local_22);
  std::allocator<char>::~allocator(&local_22);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)value_local);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")(");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_20);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"))");
  return __return_storage_ptr__;
}

Assistant:

string WasmCGenCast (PCSTR type, const string& value)
{
    string result = "((";
    result += type;
    result += ")(";
    result += value;
    result += "))";
    return result;
}